

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distinct_statistics.cpp
# Opt level: O2

unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>,_true>
__thiscall duckdb::DistinctStatistics::Copy(DistinctStatistics *this)

{
  unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true> *in_RSI;
  
  unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true>::operator->
            (in_RSI);
  HyperLogLog::Copy((HyperLogLog *)&stack0xffffffffffffffe0);
  make_uniq<duckdb::DistinctStatistics,duckdb::unique_ptr<duckdb::HyperLogLog,std::default_delete<duckdb::HyperLogLog>,true>,std::atomic<unsigned_long>const&,std::atomic<unsigned_long>const&>
            ((duckdb *)this,
             (unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>,_true> *)
             &stack0xffffffffffffffe0,(atomic<unsigned_long> *)(in_RSI + 1),
             (atomic<unsigned_long> *)(in_RSI + 2));
  ::std::unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_>::~unique_ptr
            ((unique_ptr<duckdb::HyperLogLog,_std::default_delete<duckdb::HyperLogLog>_> *)
             &stack0xffffffffffffffe0);
  return (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         (unique_ptr<duckdb::DistinctStatistics,_std::default_delete<duckdb::DistinctStatistics>_>)
         this;
}

Assistant:

unique_ptr<DistinctStatistics> DistinctStatistics::Copy() const {
	return make_uniq<DistinctStatistics>(log->Copy(), sample_count, total_count);
}